

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::RepeatedFieldHelper<9>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint8 *puVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  RepeatedPtrFieldBase *array;
  long lVar8;
  
  if (0 < *(int *)((long)field + 8)) {
    lVar8 = 0;
    do {
      uVar2 = md->tag;
      pbVar6 = output->ptr;
      if (uVar2 < 0x80) {
        *pbVar6 = (byte)uVar2;
        pbVar6 = pbVar6 + 1;
      }
      else {
        *pbVar6 = (byte)uVar2 | 0x80;
        if (uVar2 < 0x4000) {
          pbVar6[1] = (byte)(uVar2 >> 7);
          pbVar6 = pbVar6 + 2;
        }
        else {
          pbVar6 = pbVar6 + 2;
          uVar2 = uVar2 >> 7;
          do {
            pbVar7 = pbVar6;
            pbVar7[-1] = (byte)uVar2 | 0x80;
            uVar3 = uVar2 >> 7;
            pbVar6 = pbVar7 + 1;
            bVar1 = 0x3fff < uVar2;
            uVar2 = uVar3;
          } while (bVar1);
          *pbVar7 = (byte)uVar3;
        }
      }
      output->ptr = pbVar6;
      lVar5 = *(long *)((long)field + 0x10) + 8;
      if (*(long *)((long)field + 0x10) == 0) {
        lVar5 = 0;
      }
      puVar4 = io::CodedOutputStream::WriteStringWithSizeToArray
                         (*(string **)(lVar5 + lVar8 * 8),pbVar6);
      output->ptr = puVar4;
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)((long)field + 8));
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<WireFormatLite::TYPE_STRING>(AccessorHelper::Get(array, i),
                                               output);
    }
  }